

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O0

void iemgui_new_dialog(void *x,t_iemgui *iemgui,char *objname,t_float width,t_float width_min,
                      t_float height,t_float height_min,t_float range_min,t_float range_max,
                      int schedule,int mode,char *label_mode0,char *label_mode1,int canloadbang,
                      int steady,int number)

{
  char *local_510;
  char *local_500;
  char *local_4f0;
  uint local_4dc;
  t_symbol *local_478;
  t_symbol *srl [3];
  char local_458 [8];
  char objname_ [1000];
  char *label_mode0_local;
  int mode_local;
  int schedule_local;
  t_float range_max_local;
  t_float range_min_local;
  t_float height_min_local;
  t_float height_local;
  t_float width_min_local;
  t_float width_local;
  char *objname_local;
  t_iemgui *iemgui_local;
  void *x_local;
  
  objname_._992_8_ = label_mode0;
  iemgui_properties(iemgui,&local_478);
  sprintf(local_458,"|%s|",objname);
  if (canloadbang == 0) {
    local_4dc = 0xffffffff;
  }
  else {
    local_4dc = (uint)iemgui->x_isa & 1;
  }
  if (local_478 == (t_symbol *)0x0) {
    local_4f0 = "";
  }
  else {
    local_4f0 = local_478->s_name;
  }
  if (srl[0] == (t_symbol *)0x0) {
    local_500 = "";
  }
  else {
    local_500 = srl[0]->s_name;
  }
  if (srl[1] == (t_symbol *)0x0) {
    local_510 = "";
  }
  else {
    local_510 = srl[1]->s_name;
  }
  pdgui_stub_vnew((t_pd *)iemgui,"pdtk_iemgui_dialog",x,
                  "r s ffs ffs sfsfs i iss ii si sss ii ii kkk",(double)width,(double)width_min,
                  (double)height,(double)height_min,(double)range_min,(double)range_max,local_458,""
                  ,"","","","","",schedule,mode,objname_._992_8_,label_mode1,local_4dc,steady,"",
                  number,local_4f0,local_500,local_510,iemgui->x_ldx,iemgui->x_ldy,
                  (uint)iemgui->x_fsf & 0x3f,iemgui->x_fontsize,iemgui->x_bcol,iemgui->x_fcol,
                  iemgui->x_lcol);
  return;
}

Assistant:

void iemgui_new_dialog(void*x, t_iemgui*iemgui,
                       const char*objname,
                       t_float width,  t_float width_min,
                       t_float height, t_float height_min,
                       t_float range_min, t_float range_max,
                       int schedule,
                       int mode, /* lin0_log1 */
                       const char* label_mode0,
                       const char* label_mode1,
                       int canloadbang, int steady, int number)
{
    char objname_[MAXPDSTRING];
    t_symbol *srl[3];
    iemgui_properties(iemgui, srl);
    sprintf(objname_, "|%s|", objname);

    pdgui_stub_vnew(&iemgui->x_obj.ob_pd, "pdtk_iemgui_dialog", x,
        "r s ffs ffs sfsfs i iss ii si sss ii ii kkk",
        objname_,
        "",
        width, width_min, "",
        height, height_min, "",
        "", range_min, "", range_max, "",
        schedule,
        mode, label_mode0, label_mode1,
        canloadbang?iemgui->x_isa.x_loadinit:-1, steady,
        "", number,
        srl[0]?srl[0]->s_name:"", srl[1]?srl[1]->s_name:"", srl[2]?srl[2]->s_name:"",
        iemgui->x_ldx, iemgui->x_ldy,
        iemgui->x_fsf.x_font_style, iemgui->x_fontsize,
        iemgui->x_bcol, iemgui->x_fcol, iemgui->x_lcol);
}